

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadControllerWeights(ColladaParser *this,Controller *pController)

{
  byte *pbVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte *pbVar7;
  undefined4 extraout_var_03;
  Accessor **ppAVar8;
  undefined4 extraout_var_04;
  ostream *poVar9;
  ulong *puVar10;
  pointer ppVar11;
  byte bVar12;
  ulong uVar13;
  char *__s;
  size_type __new_size;
  char *attrSource;
  char *attrSemantic;
  InputChannel channel;
  char *local_250;
  char *local_248;
  undefined4 local_240;
  undefined4 uStack_23c;
  size_t sStack_238;
  size_t sStack_230;
  undefined1 *local_228;
  char *local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  Accessor *local_208;
  Accessor **local_200;
  string *local_1f8;
  InputChannel *local_1f0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_1e8;
  Accessor **local_1e0;
  string *local_1d8;
  InputChannel *local_1d0;
  string local_1c8;
  string local_1a8 [11];
  
  uVar3 = GetAttribute(this,"count");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pController->mWeightCounts,(long)iVar4);
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar5 != '\0') {
    local_1e8 = &pController->mWeights;
    local_1d0 = &pController->mWeightInputWeights;
    local_1d8 = (string *)&(pController->mWeightInputWeights).mAccessor;
    local_1e0 = &(pController->mWeightInputWeights).mResolved;
    local_1f0 = &pController->mWeightInputJoints;
    local_1f8 = (string *)&(pController->mWeightInputJoints).mAccessor;
    local_200 = &(pController->mWeightInputJoints).mResolved;
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar5 == 1) {
        if (iVar6 != 1) {
LAB_00435ce3:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar5 = strcmp((char *)CONCAT44(extraout_var,iVar5),"input");
        if ((iVar4 == 0) || (iVar5 != 0)) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 != 1) goto LAB_00435ce3;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = strcmp((char *)CONCAT44(extraout_var_02,iVar5),"vcount");
          if ((iVar4 == 0) || (iVar5 != 0)) {
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar5 != 1) goto LAB_00435ce3;
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = strcmp((char *)CONCAT44(extraout_var_03,iVar5),"v");
            if ((iVar4 == 0) || (iVar5 != 0)) {
              SkipElement(this);
            }
            else {
              pbVar7 = (byte *)GetTextContent(this);
              for (ppVar11 = (pController->mWeights).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppVar11 !=
                  (pController->mWeights).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
                bVar12 = *pbVar7;
                if (bVar12 == 0) {
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Out of data while reading <vertex_weights>","");
                  ThrowException(this,local_1a8);
                }
                if ((byte)(bVar12 - 0x3a) < 0xf6) {
                  uVar13 = 0;
                }
                else {
                  uVar3 = 0;
                  do {
                    uVar3 = (uint)(byte)(bVar12 - 0x30) + uVar3 * 10;
                    bVar12 = pbVar7[1];
                    pbVar7 = pbVar7 + 1;
                  } while (0xf5 < (byte)(bVar12 - 0x3a));
                  uVar13 = (ulong)uVar3;
                }
                ppVar11->first = uVar13;
                while( true ) {
                  uVar13 = (ulong)*pbVar7;
                  if (0x20 < uVar13) break;
                  if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
                    if (uVar13 == 0) {
                      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8,"Out of data while reading <vertex_weights>",""
                                );
                      ThrowException(this,local_1a8);
                    }
                    break;
                  }
                  pbVar7 = pbVar7 + 1;
                }
                if ((byte)(*pbVar7 - 0x3a) < 0xf6) {
                  uVar13 = 0;
                }
                else {
                  uVar3 = 0;
                  do {
                    uVar3 = (uint)(byte)((char)uVar13 - 0x30) + uVar3 * 10;
                    pbVar1 = pbVar7 + 1;
                    uVar13 = (ulong)*pbVar1;
                    pbVar7 = pbVar7 + 1;
                  } while (0xf5 < (byte)(*pbVar1 - 0x3a));
                  uVar13 = (ulong)uVar3;
                }
                ppVar11->second = uVar13;
                while (((ulong)*pbVar7 < 0x21 &&
                       ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
                  pbVar7 = pbVar7 + 1;
                }
              }
              TestClosing(this,"v");
            }
          }
          else {
            pbVar7 = (byte *)GetTextContent(this);
            puVar10 = (pController->mWeightCounts).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (puVar10 ==
                (pController->mWeightCounts).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __new_size = 0;
            }
            else {
              __new_size = 0;
              do {
                bVar12 = *pbVar7;
                if (bVar12 == 0) {
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Out of data while reading <vcount>","");
                  ThrowException(this,local_1a8);
                }
                if ((byte)(bVar12 - 0x3a) < 0xf6) {
                  uVar13 = 0;
                }
                else {
                  uVar3 = 0;
                  do {
                    uVar3 = (uint)(byte)(bVar12 - 0x30) + uVar3 * 10;
                    bVar12 = pbVar7[1];
                    pbVar7 = pbVar7 + 1;
                  } while (0xf5 < (byte)(bVar12 - 0x3a));
                  uVar13 = (ulong)uVar3;
                }
                *puVar10 = uVar13;
                while (((ulong)*pbVar7 < 0x21 &&
                       ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
                  pbVar7 = pbVar7 + 1;
                }
                __new_size = __new_size + uVar13;
                puVar10 = puVar10 + 1;
              } while (puVar10 !=
                       (pController->mWeightCounts).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            TestClosing(this,"vcount");
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::resize(local_1e8,__new_size);
          }
        }
        else {
          local_220 = (char *)0x0;
          local_218 = 0;
          local_240 = 0;
          local_208 = (Accessor *)0x0;
          sStack_238 = 0;
          sStack_230 = 0;
          local_228 = &local_218;
          uVar3 = GetAttribute(this,"semantic");
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          local_248 = (char *)CONCAT44(extraout_var_00,iVar5);
          uVar3 = GetAttribute(this,"source");
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          local_250 = (char *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = TestAttribute(this,"offset");
          if (-1 < iVar5) {
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[10])();
            sStack_230 = (size_t)iVar5;
          }
          pcVar2 = local_220;
          if (*local_250 != '#') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsupported URL format in \"",0x1b);
            poVar9 = (ostream *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_1a8,&local_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\" in source attribute of <vertex_weights> data <input> element",0x3e
                      );
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1c8);
          }
          __s = local_250 + 1;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)&local_228,0,pcVar2,(ulong)__s);
          pcVar2 = local_248;
          iVar5 = strcmp(local_248,"JOINT");
          if (iVar5 == 0) {
            local_1f0->mOffset = sStack_230;
            *(ulong *)local_1f0 = CONCAT44(uStack_23c,local_240);
            local_1f0->mIndex = sStack_238;
            std::__cxx11::string::_M_assign(local_1f8);
            ppAVar8 = local_200;
          }
          else {
            iVar5 = strcmp(pcVar2,"WEIGHT");
            if (iVar5 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unknown semantic \"",0x12);
              poVar9 = (ostream *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)local_1a8,&local_248);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\" in <vertex_weights> data <input> element",0x2a);
              std::__cxx11::stringbuf::str();
              ThrowException(this,&local_1c8);
            }
            local_1d0->mOffset = sStack_230;
            *(ulong *)local_1d0 = CONCAT44(uStack_23c,local_240);
            local_1d0->mIndex = sStack_238;
            std::__cxx11::string::_M_assign(local_1d8);
            ppAVar8 = local_1e0;
          }
          *ppAVar8 = local_208;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar5 == '\0') {
            SkipElement(this);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
          }
        }
      }
      else if (iVar6 == 2) {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_04,iVar4),"vertex_weights");
        if (iVar4 == 0) {
          return;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <vertex_weights> element.","");
        ThrowException(this,local_1a8);
      }
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar5 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerWeights(Collada::Controller& pController)
{
    // read vertex count from attributes and resize the array accordingly
    int indexCount = GetAttribute("count");
    size_t vertexCount = (size_t)mReader->getAttributeValueAsInt(indexCount);
    pController.mWeightCounts.resize(vertexCount);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for weight data. Two possible semantics: "JOINT" and "WEIGHT"
            if (IsElement("input") && vertexCount > 0)
            {
                InputChannel channel;

                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);
                int indexOffset = TestAttribute("offset");
                if (indexOffset >= 0)
                    channel.mOffset = mReader->getAttributeValueAsInt(indexOffset);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <vertex_weights> data <input> element");
                channel.mAccessor = attrSource + 1;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mWeightInputJoints = channel;
                else if (strcmp(attrSemantic, "WEIGHT") == 0)
                    pController.mWeightInputWeights = channel;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <vertex_weights> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("vcount") && vertexCount > 0)
            {
                // read weight count per vertex
                const char* text = GetTextContent();
                size_t numWeights = 0;
                for (std::vector<size_t>::iterator it = pController.mWeightCounts.begin(); it != pController.mWeightCounts.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vcount>");

                    *it = strtoul10(text, &text);
                    numWeights += *it;
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("vcount");

                // reserve weight count
                pController.mWeights.resize(numWeights);
            }
            else if (IsElement("v") && vertexCount > 0)
            {
                // read JointIndex - WeightIndex pairs
                const char* text = GetTextContent();

                for (std::vector< std::pair<size_t, size_t> >::iterator it = pController.mWeights.begin(); it != pController.mWeights.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->first = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->second = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("v");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertex_weights") != 0)
                ThrowException("Expected end of <vertex_weights> element.");

            break;
        }
    }
}